

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

void __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear
          (intrusive_list<(anonymous_namespace)::TestObject> *this)

{
  TestObject *pTVar1;
  TestObject *pTVar2;
  
  pTVar2 = this->first_;
  while (pTVar2 != (TestObject *)0x0) {
    if (pTVar2->moved == false) {
      ::(anonymous_namespace)::TestObject::creation_count =
           ::(anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar2);
    pTVar2 = pTVar1;
  }
  this->first_ = (TestObject *)0x0;
  this->last_ = (TestObject *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

inline void intrusive_list<T>::clear() noexcept {
  for (T* iter = first_; iter;) {
    T* next = iter->next_;
    delete iter;
    iter = next;
  }
  first_ = last_ = nullptr;
  size_ = 0;
}